

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

uint8_t phosg::fgetcx(FILE *f)

{
  io_error *this;
  int iVar1;
  int fd;
  string local_48;
  
  iVar1 = fgetc((FILE *)f);
  if (iVar1 != -1) {
    return (uint8_t)iVar1;
  }
  iVar1 = feof((FILE *)f);
  this = (io_error *)__cxa_allocate_exception(0x20);
  fd = fileno((FILE *)f);
  if (iVar1 == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"cannot read from stream","");
    io_error::io_error(this,fd,&local_48);
    __cxa_throw(this,&io_error::typeinfo,io_error::~io_error);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"end of stream","");
  io_error::io_error(this,fd,&local_48);
  __cxa_throw(this,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

uint8_t fgetcx(FILE* f) {
  int ret = ::fgetc(f);
  if (ret == EOF) {
    if (feof(f)) {
      throw io_error(fileno(f), "end of stream");
    } else {
      throw io_error(fileno(f), "cannot read from stream");
    }
  }
  return ret;
}